

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O0

void __thiscall Liby::Buffer::backward(Buffer *this,off_t offset)

{
  off_t offset_local;
  Buffer *this_local;
  
  if (offset < 0) {
    __assert_fail("offset >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/Buffer.cpp"
                  ,0xba,"void Liby::Buffer::backward(off_t)");
  }
  if (offset == 0) {
    if (this->rightIndex_ != this->capacity_) {
      memmove(this->buffer_ + ((this->capacity_ + this->leftIndex_) - this->rightIndex_),
              this->buffer_ + this->leftIndex_,this->capacity_ - this->rightIndex_);
      this->leftIndex_ = (this->capacity_ - this->rightIndex_) + this->leftIndex_;
      this->rightIndex_ = this->capacity_;
    }
  }
  else if (offset < this->capacity_ - this->leftIndex_) {
    if (this->capacity_ - this->rightIndex_ < offset) {
      memmove(this->buffer_ + offset + this->leftIndex_,this->buffer_ + this->leftIndex_,
              (this->capacity_ - this->leftIndex_) - offset);
      this->leftIndex_ = ((this->capacity_ - this->leftIndex_) - offset) + this->leftIndex_;
      this->rightIndex_ = this->capacity_;
    }
    else {
      memmove(this->buffer_ + offset + this->leftIndex_,this->buffer_ + this->leftIndex_,
              this->rightIndex_ - this->leftIndex_);
      this->leftIndex_ = offset + this->leftIndex_;
      this->rightIndex_ = offset + this->rightIndex_;
    }
  }
  else {
    this->rightIndex_ = this->capacity_;
    this->leftIndex_ = this->capacity_;
  }
  return;
}

Assistant:

void Buffer::backward(off_t offset) {
    assert(offset >= 0);
    if (offset == 0) {
        if (rightIndex_ == capacity_) {
            return;
        }
        ::memmove(buffer_ + leftIndex_ + capacity_ - rightIndex_,
                  buffer_ + leftIndex_, capacity_ - rightIndex_);
        leftIndex_ += capacity_ - rightIndex_;
        rightIndex_ = capacity_;
    } else if (offset >= capacity_ - leftIndex_) {
        leftIndex_ = rightIndex_ = capacity_;
    } else if (offset <= capacity_ - rightIndex_) {
        ::memmove(buffer_ + leftIndex_ + offset, buffer_ + leftIndex_,
                  rightIndex_ - leftIndex_);
        leftIndex_ += offset;
        rightIndex_ += offset;
    } else {
        ::memmove(buffer_ + leftIndex_ + offset, buffer_ + leftIndex_,
                  capacity_ - leftIndex_ - offset);
        leftIndex_ += capacity_ - leftIndex_ - offset;
        rightIndex_ = capacity_;
    }
}